

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON_Utils.c
# Opt level: O2

int apply_patch(cJSON *object,cJSON *patch,cJSON_bool case_sensitive)

{
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  cJSON_bool cVar4;
  int iVar5;
  uint uVar6;
  cJSON *pcVar7;
  cJSON *pcVar8;
  uchar *puVar9;
  char *pcVar10;
  cJSON *pcVar11;
  cJSON *pcVar12;
  size_t sVar13;
  uchar *string;
  size_t index;
  
  pcVar7 = get_object_item(patch,"path",case_sensitive);
  cVar4 = cJSON_IsString(pcVar7);
  if (cVar4 == 0) {
    return 2;
  }
  pcVar8 = get_object_item(patch,"op",case_sensitive);
  cVar4 = cJSON_IsString(pcVar8);
  if (cVar4 == 0) {
    return 3;
  }
  pcVar10 = pcVar8->valuestring;
  iVar5 = strcmp(pcVar10,"add");
  if (iVar5 == 0) {
    uVar6 = 1;
LAB_00103868:
    bVar1 = false;
LAB_0010386c:
    bVar2 = false;
LAB_0010386e:
    puVar9 = (uchar *)pcVar7->valuestring;
    if (*puVar9 == '\0' && (uVar6 & 0xfffffffd) == 1) {
      pcVar7 = get_object_item(patch,"value",case_sensitive);
      if (pcVar7 == (cJSON *)0x0) {
        return 7;
      }
      pcVar7 = cJSON_Duplicate(pcVar7,1);
      if (pcVar7 == (cJSON *)0x0) {
        return 8;
      }
      overwrite_item(object,*pcVar7);
      cJSON_free(pcVar7);
      if (object->string != (char *)0x0) {
        cJSON_free(object->string);
        object->string = (char *)0x0;
        return 0;
      }
      return 0;
    }
    if ((uVar6 & 0xfffffffe) != 4) {
      if ((uVar6 & 0xfffffffe) == 2) {
        bVar1 = false;
        goto LAB_00103924;
      }
      goto LAB_0010394a;
    }
    pcVar8 = get_object_item(patch,"from",case_sensitive);
    if (pcVar8 == (cJSON *)0x0) {
      return 4;
    }
    if (bVar1) {
      pcVar8 = detach_path(object,(uchar *)pcVar8->valuestring,case_sensitive);
    }
    else {
      pcVar8 = get_item_from_pointer(object,pcVar8->valuestring,case_sensitive);
    }
    if (pcVar8 == (cJSON *)0x0) {
      return 5;
    }
    if ((bVar2) && (pcVar8 = cJSON_Duplicate(pcVar8,1), pcVar8 == (cJSON *)0x0)) {
      return 6;
    }
  }
  else {
    iVar5 = strcmp(pcVar10,"remove");
    if (iVar5 != 0) {
      iVar5 = strcmp(pcVar10,"replace");
      if (iVar5 == 0) {
        uVar6 = 3;
        goto LAB_00103868;
      }
      iVar5 = strcmp(pcVar10,"move");
      if (iVar5 == 0) {
        uVar6 = 4;
        bVar1 = true;
        goto LAB_0010386c;
      }
      iVar5 = strcmp(pcVar10,"copy");
      if (iVar5 != 0) {
        iVar5 = strcmp(pcVar10,"test");
        if (iVar5 != 0) {
          return 3;
        }
        pcVar7 = get_item_from_pointer(object,pcVar7->valuestring,case_sensitive);
        pcVar8 = get_object_item(patch,"value",case_sensitive);
        cVar4 = compare_json(pcVar7,pcVar8,case_sensitive);
        return (uint)(cVar4 == 0);
      }
      uVar6 = 5;
      bVar2 = true;
      bVar1 = false;
      goto LAB_0010386e;
    }
    puVar9 = (uchar *)pcVar7->valuestring;
    if (*puVar9 == '\0') {
      overwrite_item(object,(cJSON)ZEXT1664(ZEXT816(0)));
      return 0;
    }
    bVar1 = true;
LAB_00103924:
    pcVar8 = detach_path(object,puVar9,case_sensitive);
    if (pcVar8 == (cJSON *)0x0) {
      return 0xd;
    }
    cJSON_Delete(pcVar8);
    if (bVar1) {
      return 0;
    }
LAB_0010394a:
    pcVar8 = get_object_item(patch,"value",case_sensitive);
    if (pcVar8 == (cJSON *)0x0) {
      return 7;
    }
    pcVar8 = cJSON_Duplicate(pcVar8,1);
    if (pcVar8 == (cJSON *)0x0) {
      return 8;
    }
  }
  puVar9 = cJSONUtils_strdup((uchar *)pcVar7->valuestring);
  pcVar10 = strrchr((char *)puVar9,0x2f);
  if (pcVar10 == (char *)0x0) {
    string = (uchar *)0x0;
  }
  else {
    *pcVar10 = '\0';
    string = (uchar *)(pcVar10 + 1);
  }
  pcVar7 = get_item_from_pointer(object,(char *)puVar9,case_sensitive);
  decode_pointer_inplace(string);
  if (string == (uchar *)0x0 || pcVar7 == (cJSON *)0x0) {
    iVar5 = 9;
LAB_00103a5a:
    cJSON_Delete(pcVar8);
  }
  else {
    cVar4 = cJSON_IsArray(pcVar7);
    if (cVar4 == 0) {
      cVar4 = cJSON_IsObject(pcVar7);
      if (cVar4 == 0) {
        iVar5 = 0;
        goto LAB_00103a5a;
      }
      if (case_sensitive == 0) {
        cJSON_DeleteItemFromObject(pcVar7,(char *)string);
      }
      else {
        cJSON_DeleteItemFromObjectCaseSensitive(pcVar7,(char *)string);
      }
      cJSON_AddItemToObject(pcVar7,(char *)string,pcVar8);
    }
    else {
      if ((*string != '-') || (string[1] != '\0')) {
        index = 0;
        cVar4 = decode_array_index_from_pointer(string,&index);
        if (cVar4 == 0) {
          iVar5 = 0xb;
        }
        else {
          pcVar11 = (cJSON *)&pcVar7->child;
          pcVar12 = pcVar11;
          sVar3 = index;
          do {
            sVar13 = sVar3;
            pcVar12 = pcVar12->next;
            if (pcVar12 == (cJSON *)0x0) break;
            sVar3 = sVar13 - 1;
          } while (sVar13 != 0);
          if (sVar13 == 0) {
            if (pcVar12 != (cJSON *)0x0) {
              pcVar8->next = pcVar12;
              pcVar8->prev = pcVar12->prev;
              pcVar12->prev = pcVar8;
              if (pcVar12 != *(cJSON **)pcVar11) {
                pcVar11 = pcVar8->prev;
              }
              pcVar11->next = pcVar8;
              goto LAB_00103bba;
            }
            goto LAB_00103b9a;
          }
          iVar5 = 10;
        }
        goto LAB_00103a5a;
      }
LAB_00103b9a:
      cJSON_AddItemToArray(pcVar7,pcVar8);
    }
LAB_00103bba:
    iVar5 = 0;
  }
  if (puVar9 != (uchar *)0x0) {
    cJSON_free(puVar9);
  }
  return iVar5;
}

Assistant:

static int apply_patch(cJSON *object, const cJSON *patch, const cJSON_bool case_sensitive)
{
    cJSON *path = NULL;
    cJSON *value = NULL;
    cJSON *parent = NULL;
    enum patch_operation opcode = INVALID;
    unsigned char *parent_pointer = NULL;
    unsigned char *child_pointer = NULL;
    int status = 0;

    path = get_object_item(patch, "path", case_sensitive);
    if (!cJSON_IsString(path))
    {
        /* malformed patch. */
        status = 2;
        goto cleanup;
    }

    opcode = decode_patch_operation(patch, case_sensitive);
    if (opcode == INVALID)
    {
        status = 3;
        goto cleanup;
    }
    else if (opcode == TEST)
    {
        /* compare value: {...} with the given path */
        status = !compare_json(get_item_from_pointer(object, path->valuestring, case_sensitive), get_object_item(patch, "value", case_sensitive), case_sensitive);
        goto cleanup;
    }

    /* special case for replacing the root */
    if (path->valuestring[0] == '\0')
    {
        if (opcode == REMOVE)
        {
            static const cJSON invalid = { NULL, NULL, NULL, cJSON_Invalid, NULL, 0, 0, NULL};

            overwrite_item(object, invalid);

            status = 0;
            goto cleanup;
        }

        if ((opcode == REPLACE) || (opcode == ADD))
        {
            value = get_object_item(patch, "value", case_sensitive);
            if (value == NULL)
            {
                /* missing "value" for add/replace. */
                status = 7;
                goto cleanup;
            }

            value = cJSON_Duplicate(value, 1);
            if (value == NULL)
            {
                /* out of memory for add/replace. */
                status = 8;
                goto cleanup;
            }

            overwrite_item(object, *value);

            /* delete the duplicated value */
            cJSON_free(value);
            value = NULL;

            /* the string "value" isn't needed */
            if (object->string != NULL)
            {
                cJSON_free(object->string);
                object->string = NULL;
            }

            status = 0;
            goto cleanup;
        }
    }

    if ((opcode == REMOVE) || (opcode == REPLACE))
    {
        /* Get rid of old. */
        cJSON *old_item = detach_path(object, (unsigned char*)path->valuestring, case_sensitive);
        if (old_item == NULL)
        {
            status = 13;
            goto cleanup;
        }
        cJSON_Delete(old_item);
        if (opcode == REMOVE)
        {
            /* For Remove, this job is done. */
            status = 0;
            goto cleanup;
        }
    }

    /* Copy/Move uses "from". */
    if ((opcode == MOVE) || (opcode == COPY))
    {
        cJSON *from = get_object_item(patch, "from", case_sensitive);
        if (from == NULL)
        {
            /* missing "from" for copy/move. */
            status = 4;
            goto cleanup;
        }

        if (opcode == MOVE)
        {
            value = detach_path(object, (unsigned char*)from->valuestring, case_sensitive);
        }
        if (opcode == COPY)
        {
            value = get_item_from_pointer(object, from->valuestring, case_sensitive);
        }
        if (value == NULL)
        {
            /* missing "from" for copy/move. */
            status = 5;
            goto cleanup;
        }
        if (opcode == COPY)
        {
            value = cJSON_Duplicate(value, 1);
        }
        if (value == NULL)
        {
            /* out of memory for copy/move. */
            status = 6;
            goto cleanup;
        }
    }
    else /* Add/Replace uses "value". */
    {
        value = get_object_item(patch, "value", case_sensitive);
        if (value == NULL)
        {
            /* missing "value" for add/replace. */
            status = 7;
            goto cleanup;
        }
        value = cJSON_Duplicate(value, 1);
        if (value == NULL)
        {
            /* out of memory for add/replace. */
            status = 8;
            goto cleanup;
        }
    }

    /* Now, just add "value" to "path". */

    /* split pointer in parent and child */
    parent_pointer = cJSONUtils_strdup((unsigned char*)path->valuestring);
    child_pointer = (unsigned char*)strrchr((char*)parent_pointer, '/');
    if (child_pointer != NULL)
    {
        child_pointer[0] = '\0';
        child_pointer++;
    }
    parent = get_item_from_pointer(object, (char*)parent_pointer, case_sensitive);
    decode_pointer_inplace(child_pointer);

    /* add, remove, replace, move, copy, test. */
    if ((parent == NULL) || (child_pointer == NULL))
    {
        /* Couldn't find object to add to. */
        status = 9;
        goto cleanup;
    }
    else if (cJSON_IsArray(parent))
    {
        if (strcmp((char*)child_pointer, "-") == 0)
        {
            cJSON_AddItemToArray(parent, value);
            value = NULL;
        }
        else
        {
            size_t index = 0;
            if (!decode_array_index_from_pointer(child_pointer, &index))
            {
                status = 11;
                goto cleanup;
            }

            if (!insert_item_in_array(parent, index, value))
            {
                status = 10;
                goto cleanup;
            }
            value = NULL;
        }
    }
    else if (cJSON_IsObject(parent))
    {
        if (case_sensitive)
        {
            cJSON_DeleteItemFromObjectCaseSensitive(parent, (char*)child_pointer);
        }
        else
        {
            cJSON_DeleteItemFromObject(parent, (char*)child_pointer);
        }
        cJSON_AddItemToObject(parent, (char*)child_pointer, value);
        value = NULL;
    }

cleanup:
    if (value != NULL)
    {
        cJSON_Delete(value);
    }
    if (parent_pointer != NULL)
    {
        cJSON_free(parent_pointer);
    }

    return status;
}